

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_tests.cpp
# Opt level: O0

double __thiscall ChebTools::ChebyshevExpansion::real_roots_time(ChebyshevExpansion *this,long N)

{
  rep rVar1;
  duration<long,_std::ratio<1L,_1000000000L>_> local_60;
  duration<double,_std::ratio<1L,_1L>_> local_58 [2];
  double elap_us;
  time_point endTime;
  vector<double,_std::allocator<double>_> ypts;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_20;
  int i;
  time_point startTime;
  long N_local;
  ChebyshevExpansion *this_local;
  
  startTime.__d.__r = (duration)(duration)N;
  tStack_20.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  for (ypts.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._4_4_ = 0;
      (long)ypts.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
            ._M_end_of_storage._4_4_ < (long)startTime.__d.__r;
      ypts.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ =
           ypts.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._4_4_ + 1) {
    real_roots((vector<double,_std::allocator<double>_> *)&endTime,this,true);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)&endTime);
  }
  elap_us = (double)std::chrono::_V2::system_clock::now();
  local_60.__r = (rep_conflict)
                 std::chrono::operator-
                           ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                             *)&elap_us,&stack0xffffffffffffffe0);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,std::ratio<1l,1l>> *)local_58,&local_60);
  rVar1 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(local_58);
  return (rVar1 / (double)(long)startTime.__d.__r) * 1000000.0;
}

Assistant:

double ChebyshevExpansion::real_roots_time(long N) {
    auto startTime = std::chrono::system_clock::now();
    for (int i = 0; i < N; ++i) {
        auto ypts = real_roots();
    }
    auto endTime = std::chrono::system_clock::now();
    auto elap_us = std::chrono::duration<double>(endTime - startTime).count() / N*1e6;
    return elap_us;
}